

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

bool __thiscall flatbuffers::BinaryAnnotator::ContainsSection(BinaryAnnotator *this,uint64_t offset)

{
  iterator iVar1;
  long lVar2;
  bool bVar3;
  uint64_t local_10;
  
  local_10 = offset;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
          ::lower_bound(&(this->sections_)._M_t,&local_10);
  if (((_Rb_tree_header *)iVar1._M_node == &(this->sections_)._M_t._M_impl.super__Rb_tree_header) ||
     (bVar3 = true, *(uint64_t *)(iVar1._M_node + 1) != local_10)) {
    if ((iVar1._M_node != (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) &&
       (lVar2 = std::_Rb_tree_decrement(iVar1._M_node), *(ulong *)(lVar2 + 0x20) <= local_10)) {
      return local_10 <
             (ulong)(*(long *)(*(long *)(lVar2 + 0x58) + -0x98) +
                    *(long *)(*(long *)(lVar2 + 0x58) + -0xa0));
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool BinaryAnnotator::ContainsSection(const uint64_t offset) {
  auto it = sections_.lower_bound(offset);
  // If the section is found, check that it is exactly equal its offset.
  if (it != sections_.end() && it->first == offset) { return true; }

  // If this was the first section, there are no other previous sections to
  // check.
  if (it == sections_.begin()) { return false; }

  // Go back one section.
  --it;

  // And check that if the offset is covered by the section.
  return offset >= it->first && offset < it->second.regions.back().offset +
                                             it->second.regions.back().length;
}